

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O3

int EVP_EncodedLength(size_t *out_len,size_t len)

{
  undefined1 auVar1 [16];
  
  if (len < 0xbffffffffffffffe) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = len + 2;
    *out_len = (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) * 2 + 1;
  }
  return (uint)(len < 0xbffffffffffffffe);
}

Assistant:

int EVP_EncodedLength(size_t *out_len, size_t len) {
  if (len + 2 < len) {
    return 0;
  }
  len += 2;
  len /= 3;

  if (((len << 2) >> 2) != len) {
    return 0;
  }
  len <<= 2;

  if (len + 1 < len) {
    return 0;
  }
  len++;

  *out_len = len;
  return 1;
}